

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InvalidInputException::InvalidInputException<unsigned_int,unsigned_long>
          (InvalidInputException *this,string *msg,uint params,unsigned_long params_1)

{
  undefined4 in_register_00000014;
  unsigned_long in_R8;
  string local_30;
  
  Exception::ConstructMessage<unsigned_int,unsigned_long>
            (&local_30,(Exception *)msg,(string *)CONCAT44(in_register_00000014,params),
             (uint)params_1,in_R8);
  InvalidInputException(this,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}